

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall lzham::symbol_codec::start_encoding(symbol_codec *this,uint expected_file_size)

{
  bool bVar1;
  undefined4 in_ESI;
  symbol_codec *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  in_RDI->m_mode = cEncoding;
  in_RDI->m_total_model_updates = 0;
  in_RDI->m_total_bits_written = 0;
  bVar1 = put_bits_init((symbol_codec *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                        (uint)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    vector<lzham::symbol_codec::output_symbol>::try_resize
              ((vector<lzham::symbol_codec::output_symbol> *)
               CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(uint)((ulong)in_RDI >> 0x20),
               SUB81((ulong)in_RDI >> 0x18,0));
    arith_start_encoding(in_RDI);
  }
  return bVar1;
}

Assistant:

bool symbol_codec::start_encoding(uint expected_file_size)
   {
      m_mode = cEncoding;

      m_total_model_updates = 0;
      m_total_bits_written = 0;

      if (!put_bits_init(expected_file_size))
         return false;

      m_output_syms.try_resize(0);

      arith_start_encoding();

      return true;
   }